

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O2

string * choc::text::addDoubleQuotes(string *__return_storage_ptr__,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,"\"",text);
  std::operator+(__return_storage_ptr__,&bStack_38,"\"");
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string addDoubleQuotes (std::string text)          { return "\"" + std::move (text) + "\""; }